

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

CharFormat testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  byte ch;
  bool bVar1;
  CharFormat CVar2;
  ostream *poVar3;
  size_t index;
  size_t sVar4;
  CharFormat CVar5;
  
  std::operator<<(os,"\"");
  CVar5 = kAsIs;
  bVar1 = false;
  for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
    ch = begin[sVar4];
    if (bVar1) {
      bVar1 = IsXDigit(ch);
      if (bVar1) {
        poVar3 = std::operator<<(os,"\" ");
        std::operator<<(poVar3,"\"");
      }
    }
    CVar2 = PrintAsStringLiteralTo((uint)ch,os);
    bVar1 = CVar2 == kHexEscape;
    if (bVar1) {
      CVar5 = kHexEscape;
    }
  }
  std::operator<<(os,"\"");
  return CVar5;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}